

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressBegin_usingCDict_advanced
                 (ZSTD_CCtx *cctx,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
                 unsigned_long_long pledgedSrcSize)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ZSTD_CCtx_params *pZVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  ZSTD_CCtx_params in_stack_fffffffffffffee8;
  undefined1 local_80 [8];
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined8 uStack_68;
  undefined8 local_60;
  int local_58;
  unsigned_long_long uVar8;
  
  if (cdict != (ZSTD_CDict *)0x0) {
    pZVar9 = &cctx->requestedParams;
    puVar10 = (undefined8 *)local_80;
    for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar10 = *(undefined8 *)pZVar9;
      pZVar9 = (ZSTD_CCtx_params *)&(pZVar9->cParams).chainLog;
      puVar10 = puVar10 + 1;
    }
    local_80._4_4_ = (cdict->matchState).cParams.windowLog;
    unique0x10000188 = (cdict->matchState).cParams.chainLog;
    uVar1 = (cdict->matchState).cParams.hashLog;
    uVar2 = (cdict->matchState).cParams.searchLog;
    uVar3 = (cdict->matchState).cParams.minMatch;
    uStack_6c = uVar3;
    uStack_68._0_4_ = (cdict->matchState).cParams.targetLength;
    uStack_68._4_4_ = (cdict->matchState).cParams.strategy;
    uStack_74 = uVar1;
    local_70 = uVar2;
    if (pledgedSrcSize != 0xffffffffffffffff) {
      if (pledgedSrcSize < 2) {
        uVar6 = 1;
      }
      else {
        uVar8 = 0x80000;
        if (pledgedSrcSize < 0x80000) {
          uVar8 = pledgedSrcSize;
        }
        uVar5 = (int)uVar8 - 1;
        uVar6 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar6 = (uVar6 ^ 0xffffffe0) + 0x21;
      }
      if (uVar6 < (uint)local_80._4_4_) {
        uVar6 = local_80._4_4_;
      }
      stack0xffffffffffffff84 = CONCAT44(unique0x10000188,uVar6);
    }
    local_60 = fParams._0_8_;
    local_58 = fParams.noDictIDFlag;
    puVar10 = (undefined8 *)local_80;
    puVar11 = (undefined8 *)&stack0xfffffffffffffee8;
    for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar11 = *puVar10;
      puVar10 = puVar10 + 1;
      puVar11 = puVar11 + 1;
    }
    sVar4 = ZSTD_compressBegin_internal
                      (cctx,(void *)0x0,0,ZSTD_dct_auto,ZSTD_dtlm_fast,cdict,
                       in_stack_fffffffffffffee8,pledgedSrcSize,ZSTDb_not_buffered);
    return sVar4;
  }
  return 0xffffffffffffffe0;
}

Assistant:

size_t ZSTD_compressBegin_usingCDict_advanced(
    ZSTD_CCtx* const cctx, const ZSTD_CDict* const cdict,
    ZSTD_frameParameters const fParams, unsigned long long const pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_compressBegin_usingCDict_advanced");
    if (cdict==NULL) return ERROR(dictionary_wrong);
    {   ZSTD_CCtx_params params = cctx->requestedParams;
        params.cParams = ZSTD_getCParamsFromCDict(cdict);
        /* Increase window log to fit the entire dictionary and source if the
         * source size is known. Limit the increase to 19, which is the
         * window log for compression level 1 with the largest source size.
         */
        if (pledgedSrcSize != ZSTD_CONTENTSIZE_UNKNOWN) {
            U32 const limitedSrcSize = (U32)MIN(pledgedSrcSize, 1U << 19);
            U32 const limitedSrcLog = limitedSrcSize > 1 ? ZSTD_highbit32(limitedSrcSize - 1) + 1 : 1;
            params.cParams.windowLog = MAX(params.cParams.windowLog, limitedSrcLog);
        }
        params.fParams = fParams;
        return ZSTD_compressBegin_internal(cctx,
                                           NULL, 0, ZSTD_dct_auto, ZSTD_dtlm_fast,
                                           cdict,
                                           params, pledgedSrcSize,
                                           ZSTDb_not_buffered);
    }
}